

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::addTypeHandlerImpl::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,HandlerBase **existing,HandlerBase *replacement)

{
  Fault local_28;
  Fault f;
  HandlerBase *replacement_local;
  HandlerBase **existing_local;
  anon_class_1_0_00000001 *this_local;
  
  if (*existing == replacement) {
    return;
  }
  f.exception = (Exception *)replacement;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x365,FAILED,"existing == replacement",
             "\"type already has a different registered handler\"",
             (char (*) [48])"type already has a different registered handler");
  kj::_::Debug::Fault::fatal(&local_28);
}

Assistant:

void JsonCodec::addTypeHandlerImpl(Type type, HandlerBase& handler) {
  impl->typeHandlers.upsert(type, &handler, [](HandlerBase*& existing, HandlerBase* replacement) {
    KJ_REQUIRE(existing == replacement, "type already has a different registered handler");
  });
}